

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

void __thiscall
xs::ProcessFinishedMessage::ProcessFinishedMessage
          (ProcessFinishedMessage *this,deUint8 *data,size_t dataSize)

{
  int iVar1;
  undefined1 local_38 [8];
  MessageParser parser;
  size_t dataSize_local;
  deUint8 *data_local;
  ProcessFinishedMessage *this_local;
  
  parser.m_pos = dataSize;
  Message::Message(&this->super_Message,MESSAGETYPE_PROCESS_FINISHED);
  (this->super_Message)._vptr_Message = (_func_int **)&PTR__ProcessFinishedMessage_001b3900;
  MessageParser::MessageParser((MessageParser *)local_38,data,parser.m_pos);
  iVar1 = MessageParser::get<int>((MessageParser *)local_38);
  *(int *)&(this->super_Message).field_0xc = iVar1;
  MessageParser::assumEnd((MessageParser *)local_38);
  return;
}

Assistant:

ProcessFinishedMessage::ProcessFinishedMessage (const deUint8* data, size_t dataSize)
	: Message(MESSAGETYPE_PROCESS_FINISHED)
{
	MessageParser parser(data, dataSize);
	exitCode = parser.get<int>();
	parser.assumEnd();
}